

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_default_xml_generator.hpp
# Opt level: O2

void __thiscall
iutest::DefaultXmlGeneratorListener::~DefaultXmlGeneratorListener(DefaultXmlGeneratorListener *this)

{
  Variable *pVVar1;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__DefaultXmlGeneratorListener_0012f2f0;
  FileClose(this);
  pVVar1 = TestEnv::get_vars();
  TestEventListeners::set_default_xml_generator(&pVVar1->m_event_listeners,(TestEventListener *)0x0)
  ;
  std::__cxx11::string::~string((string *)&this->m_output_path);
  std::__cxx11::string::~string((string *)&this->m_output_path_format);
  return;
}

Assistant:

virtual ~DefaultXmlGeneratorListener()
    {
        FileClose();
        TestEnv::event_listeners().set_default_xml_generator(NULL);
    }